

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::ClipperOffset::FixOrientations(ClipperOffset *this)

{
  PolyNode *pPVar1;
  pointer pIVar2;
  double dVar3;
  cInt cVar4;
  cInt cVar5;
  cInt cVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer ppPVar9;
  pointer ppPVar10;
  long lVar11;
  
  lVar11 = (this->m_lowest).X;
  if (lVar11 < 0) {
    ppPVar10 = (this->m_polyNodes).Childs.
               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    ppPVar10 = (this->m_polyNodes).Childs.
               super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    dVar3 = Area(&ppPVar10[(int)lVar11]->Contour);
    if (dVar3 < 0.0) {
      ppPVar9 = (this->m_polyNodes).Childs.
                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppPVar9 - (long)ppPVar10) >> 3) < 1) {
        return;
      }
      lVar11 = 0;
      do {
        pPVar1 = ppPVar10[lVar11];
        if ((pPVar1->m_endtype == etClosedPolygon) ||
           ((pPVar1->m_endtype == etClosedLine && (dVar3 = Area(&pPVar1->Contour), 0.0 <= dVar3))))
        {
          pIVar2 = (pPVar1->Contour).
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pIVar7 = *(pointer *)
                    ((long)&(pPVar1->Contour).
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl + 8);
          pIVar8 = pIVar7 + -1;
          if (pIVar2 < pIVar8 && pIVar2 != pIVar7) {
            do {
              pIVar7 = pIVar2 + 1;
              cVar4 = pIVar2->X;
              cVar5 = pIVar2->Y;
              cVar6 = pIVar8->Y;
              pIVar2->X = pIVar8->X;
              pIVar2->Y = cVar6;
              pIVar8->X = cVar4;
              pIVar8->Y = cVar5;
              pIVar8 = pIVar8 + -1;
              pIVar2 = pIVar7;
            } while (pIVar7 < pIVar8);
            ppPVar10 = (this->m_polyNodes).Childs.
                       super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppPVar9 = (this->m_polyNodes).Childs.
                      super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)((ulong)((long)ppPVar9 - (long)ppPVar10) >> 3));
      return;
    }
  }
  ppPVar9 = (this->m_polyNodes).Childs.
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppPVar9 - (long)ppPVar10) >> 3)) {
    lVar11 = 0;
    do {
      pPVar1 = ppPVar10[lVar11];
      if ((pPVar1->m_endtype == etClosedLine) && (dVar3 = Area(&pPVar1->Contour), dVar3 < 0.0)) {
        pIVar2 = (pPVar1->Contour).
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pIVar7 = *(pointer *)
                  ((long)&(pPVar1->Contour).
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl + 8);
        pIVar8 = pIVar7 + -1;
        if (pIVar2 < pIVar8 && pIVar2 != pIVar7) {
          do {
            pIVar7 = pIVar2 + 1;
            cVar4 = pIVar2->X;
            cVar5 = pIVar2->Y;
            cVar6 = pIVar8->Y;
            pIVar2->X = pIVar8->X;
            pIVar2->Y = cVar6;
            pIVar8->X = cVar4;
            pIVar8->Y = cVar5;
            pIVar8 = pIVar8 + -1;
            pIVar2 = pIVar7;
          } while (pIVar7 < pIVar8);
          ppPVar10 = (this->m_polyNodes).Childs.
                     super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppPVar9 = (this->m_polyNodes).Childs.
                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)ppPVar9 - (long)ppPVar10) >> 3));
  }
  return;
}

Assistant:

void ClipperOffset::FixOrientations()
{
  //fixup orientations of all closed paths if the orientation of the
  //closed path with the lowermost vertex is wrong ...
  if (m_lowest.X >= 0 && 
    !Orientation(m_polyNodes.Childs[(int)m_lowest.X]->Contour))
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon ||
        (node.m_endtype == etClosedLine && Orientation(node.Contour)))
          ReversePath(node.Contour);
    }
  } else
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedLine && !Orientation(node.Contour))
        ReversePath(node.Contour);
    }
  }
}